

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int fast_mp_montgomery_reduce(mp_int *x,mp_int *n,mp_digit rho)

{
  ulong uVar1;
  uint uVar2;
  mp_digit *pmVar3;
  mp_digit mVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  mp_digit *pmVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  mp_word W [512];
  mp_digit local_2038;
  ulong auStack_2030 [1024];
  
  uVar2 = x->used;
  uVar10 = uVar2;
  if (x->alloc <= n->used) {
    iVar9 = mp_grow(x,n->used + 1);
    if (iVar9 != 0) {
      return iVar9;
    }
    uVar10 = x->used;
  }
  pmVar3 = x->dp;
  uVar16 = 0;
  uVar18 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar18 = uVar16;
  }
  pmVar13 = &local_2038;
  for (; (int)uVar18 != (int)uVar16; uVar16 = uVar16 + 1) {
    mVar4 = pmVar3[uVar16];
    pmVar13[1] = 0;
    *pmVar13 = mVar4;
    pmVar13 = pmVar13 + 2;
  }
  uVar10 = n->used;
  uVar8 = uVar10 * 2;
  while (uVar11 = (uint)uVar18,
        uVar11 == uVar8 || SBORROW4(uVar11,uVar8) != (int)(uVar11 + uVar10 * -2) < 0) {
    *pmVar13 = 0;
    pmVar13[1] = 0;
    pmVar13 = pmVar13 + 2;
    uVar18 = (ulong)(uVar11 + 1);
  }
  uVar16 = 0;
  uVar18 = 0;
  if (0 < (int)uVar10) {
    uVar18 = (ulong)uVar10;
  }
  while (uVar16 != uVar18) {
    puVar14 = auStack_2030 + uVar16 * 2 + -1;
    uVar5 = *puVar14;
    pmVar13 = n->dp;
    puVar15 = puVar14;
    for (lVar17 = 0; uVar10 != (uint)lVar17; lVar17 = lVar17 + 1) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar5 * rho & 0xfffffffffffffff;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pmVar13[lVar17];
      uVar12 = SUB168(auVar6 * auVar7,0);
      uVar1 = *puVar15;
      *puVar15 = *puVar15 + uVar12;
      puVar15[1] = puVar15[1] + SUB168(auVar6 * auVar7,8) + (ulong)CARRY8(uVar1,uVar12);
      puVar15 = puVar15 + 2;
    }
    uVar1 = auStack_2030[uVar16 * 2];
    uVar12 = *puVar14 >> 0x3c | uVar1 << 4;
    uVar16 = uVar16 + 1;
    puVar15 = auStack_2030 + uVar16 * 2 + -1;
    uVar5 = *puVar15;
    *puVar15 = *puVar15 + uVar12;
    auStack_2030[uVar16 * 2] =
         auStack_2030[uVar16 * 2] + (uVar1 >> 0x3c) + (ulong)CARRY8(uVar5,uVar12);
  }
  iVar9 = (int)uVar18;
  puVar15 = auStack_2030 + uVar18 * 2 + -1;
  while( true ) {
    iVar9 = iVar9 + 1;
    puVar14 = puVar15 + 2;
    if ((int)(uVar8 | 1) < iVar9) break;
    uVar16 = *puVar15 >> 0x3c | puVar15[1] << 4;
    uVar18 = *puVar14;
    *puVar14 = *puVar14 + uVar16;
    puVar15[3] = puVar15[3] + (puVar15[1] >> 0x3c) + (ulong)CARRY8(uVar18,uVar16);
    puVar15 = puVar14;
  }
  puVar15 = auStack_2030 + (long)(int)uVar10 * 2 + -1;
  for (lVar17 = 0; (int)lVar17 <= (int)uVar10; lVar17 = lVar17 + 1) {
    uVar18 = *puVar15;
    puVar15 = puVar15 + 2;
    pmVar3[lVar17] = uVar18 & 0xfffffffffffffff;
  }
  for (; (int)lVar17 < (int)uVar2; lVar17 = lVar17 + 1) {
    pmVar3[lVar17] = 0;
  }
  x->used = uVar10 + 1;
  mp_clamp(x);
  iVar9 = mp_cmp_mag(x,n);
  if (iVar9 == -1) {
    return 0;
  }
  iVar9 = s_mp_sub(x,n,x);
  return iVar9;
}

Assistant:

int fast_mp_montgomery_reduce (mp_int * x, mp_int * n, mp_digit rho)
{
  int     ix, res, olduse;
  mp_word W[MP_WARRAY];

  /* get old used count */
  olduse = x->used;

  /* grow a as required */
  if (x->alloc < n->used + 1) {
    if ((res = mp_grow (x, n->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* first we have to get the digits of the input into
   * an array of double precision words W[...]
   */
  {
    register mp_word *_W;
    register mp_digit *tmpx;

    /* alias for the W[] array */
    _W   = W;

    /* alias for the digits of  x*/
    tmpx = x->dp;

    /* copy the digits of a into W[0..a->used-1] */
    for (ix = 0; ix < x->used; ix++) {
      *_W++ = *tmpx++;
    }

    /* zero the high words of W[a->used..m->used*2] */
    for (; ix < n->used * 2 + 1; ix++) {
      *_W++ = 0;
    }
  }

  /* now we proceed to zero successive digits
   * from the least significant upwards
   */
  for (ix = 0; ix < n->used; ix++) {
    /* mu = ai * m' mod b
     *
     * We avoid a double precision multiplication (which isn't required)
     * by casting the value down to a mp_digit.  Note this requires
     * that W[ix-1] have  the carry cleared (see after the inner loop)
     */
    register mp_digit mu;
    mu = (mp_digit) (((W[ix] & MP_MASK) * rho) & MP_MASK);

    /* a = a + mu * m * b**i
     *
     * This is computed in place and on the fly.  The multiplication
     * by b**i is handled by offseting which columns the results
     * are added to.
     *
     * Note the comba method normally doesn't handle carries in the
     * inner loop In this case we fix the carry from the previous
     * column since the Montgomery reduction requires digits of the
     * result (so far) [see above] to work.  This is
     * handled by fixing up one carry after the inner loop.  The
     * carry fixups are done in order so after these loops the
     * first m->used words of W[] have the carries fixed
     */
    {
      register int iy;
      register mp_digit *tmpn;
      register mp_word *_W;

      /* alias for the digits of the modulus */
      tmpn = n->dp;

      /* Alias for the columns set by an offset of ix */
      _W = W + ix;

      /* inner loop */
      for (iy = 0; iy < n->used; iy++) {
          *_W++ += ((mp_word)mu) * ((mp_word)*tmpn++);
      }
    }

    /* now fix carry for next digit, W[ix+1] */
    W[ix + 1] += W[ix] >> ((mp_word) DIGIT_BIT);
  }

  /* now we have to propagate the carries and
   * shift the words downward [all those least
   * significant digits we zeroed].
   */
  {
    register mp_digit *tmpx;
    register mp_word *_W, *_W1;

    /* nox fix rest of carries */

    /* alias for current word */
    _W1 = W + ix;

    /* alias for next word, where the carry goes */
    _W = W + ++ix;

    for (; ix <= n->used * 2 + 1; ix++) {
      *_W++ += *_W1++ >> ((mp_word) DIGIT_BIT);
    }

    /* copy out, A = A/b**n
     *
     * The result is A/b**n but instead of converting from an
     * array of mp_word to mp_digit than calling mp_rshd
     * we just copy them in the right order
     */

    /* alias for destination word */
    tmpx = x->dp;

    /* alias for shifted double precision result */
    _W = W + n->used;

    for (ix = 0; ix < n->used + 1; ix++) {
      *tmpx++ = (mp_digit)(*_W++ & ((mp_word) MP_MASK));
    }

    /* zero oldused digits, if the input a was larger than
     * m->used+1 we'll have to clear the digits
     */
    for (; ix < olduse; ix++) {
      *tmpx++ = 0;
    }
  }

  /* set the max used and clamp */
  x->used = n->used + 1;
  mp_clamp (x);

  /* if A >= m then A = A - m */
  if (mp_cmp_mag (x, n) != MP_LT) {
    return s_mp_sub (x, n, x);
  }
  return MP_OKAY;
}